

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void roaring_bitmap_remove(roaring_bitmap_t *r,uint32_t val)

{
  ushort uVar1;
  uint16_t *puVar2;
  uint8_t *puVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  ushort uVar6;
  int iVar7;
  undefined8 in_RAX;
  shared_container_t *sc;
  run_container_t *prVar8;
  void **ppvVar9;
  run_container_t *prVar10;
  uint i;
  uint uVar11;
  uint8_t newtypecode;
  undefined8 uStack_38;
  
  iVar7 = (r->high_low_container).size;
  if ((long)iVar7 != 0) {
    puVar2 = (r->high_low_container).keys;
    uVar6 = (ushort)(val >> 0x10);
    if (puVar2[(long)iVar7 + -1] != uVar6) {
      if (iVar7 < 1) {
        return;
      }
      iVar7 = iVar7 + -1;
      uVar11 = 0;
      do {
        i = iVar7 + uVar11 >> 1;
        uVar1 = *(ushort *)((long)puVar2 + (ulong)(iVar7 + uVar11 & 0xfffffffe));
        if (uVar1 < uVar6) {
          uVar11 = i + 1;
        }
        else {
          if (uVar1 <= uVar6) goto LAB_00109149;
          iVar7 = i - 1;
        }
      } while ((int)uVar11 <= iVar7);
      i = ~uVar11;
      goto LAB_00109140;
    }
  }
  i = iVar7 - 1;
LAB_00109140:
  if (-1 < (int)i) {
LAB_00109149:
    ppvVar9 = (r->high_low_container).containers;
    puVar3 = (r->high_low_container).typecodes;
    uVar11 = i & 0xffff;
    sc = (shared_container_t *)ppvVar9[uVar11];
    uStack_38 = in_RAX;
    if (puVar3[uVar11] == '\x04') {
      sc = (shared_container_t *)shared_container_extract_copy(sc,puVar3 + uVar11);
      ppvVar9 = (r->high_low_container).containers;
    }
    *(shared_container_t **)((long)ppvVar9 + (ulong)(uVar11 * 8)) = sc;
    uVar5 = (r->high_low_container).typecodes[uVar11];
    prVar10 = *(run_container_t **)((long)(r->high_low_container).containers + (ulong)(uVar11 * 8));
    uStack_38._7_1_ = uVar5;
    prVar8 = (run_container_t *)
             container_remove(prVar10,(uint16_t)val,uVar5,(uint8_t *)((long)&uStack_38 + 7));
    if (prVar8 != prVar10) {
      container_free(prVar10,uVar5);
      (r->high_low_container).containers[i] = prVar8;
      (r->high_low_container).typecodes[i] = uStack_38._7_1_;
    }
    uVar4 = uStack_38._7_1_;
    prVar10 = prVar8;
    uVar5 = uStack_38._7_1_;
    if (uStack_38._7_1_ == '\x04') {
      uVar5 = *(uint8_t *)&prVar8->runs;
      prVar10 = *(run_container_t **)prVar8;
    }
    if (uVar5 == '\x03') {
      iVar7 = run_container_cardinality(prVar10);
    }
    else {
      iVar7 = prVar10->n_runs;
    }
    if (iVar7 == 0) {
      ra_remove_at_index_and_free(&r->high_low_container,i);
    }
    else {
      (r->high_low_container).containers[i] = prVar8;
      (r->high_low_container).typecodes[i] = uVar4;
    }
  }
  return;
}

Assistant:

void roaring_bitmap_remove(roaring_bitmap_t *r, uint32_t val) {
    const uint16_t hb = val >> 16;
    const int i = ra_get_index(&r->high_low_container, hb);
    uint8_t typecode;
    if (i >= 0) {
        ra_unshare_container_at_index(&r->high_low_container, (uint16_t)i);
        container_t *container = ra_get_container_at_index(
            &r->high_low_container, (uint16_t)i, &typecode);
        uint8_t newtypecode = typecode;
        container_t *container2 =
            container_remove(container, val & 0xFFFF, typecode, &newtypecode);
        if (container2 != container) {
            container_free(container, typecode);
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
        }
        if (container_get_cardinality(container2, newtypecode) != 0) {
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
        } else {
            ra_remove_at_index_and_free(&r->high_low_container, i);
        }
    }
}